

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.cpp
# Opt level: O2

ssize_t __thiscall
Liby::UdpConnection::send(UdpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 __p;
  ssize_t extraout_RAX;
  size_t __n_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined1 local_58 [16];
  off_t len_local;
  char *base_local;
  udp_io_task utask;
  
  base_local = (char *)CONCAT44(in_register_00000034,__fd);
  len_local = (off_t)__buf;
  if (this->socket_ != (UdpSocket *)0x0) {
    utask.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    utask.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    utask.handler_._M_t.
    super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>.
    _M_t.
    super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
    super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
          )(__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>)
           0x0;
    __n_00 = __n;
    std::make_shared<Liby::Buffer,char_const*&,long&>((char **)local_58,(long *)&base_local);
    std::__shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&utask.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    utask.dest_ = &this->peer_;
    __buf_00 = extraout_RDX;
    if (*(long *)(__n + 0x10) != 0) {
      std::make_unique<std::function<void()>,std::function<void()>const&>
                ((function<void_()> *)local_58);
      __p = local_58._0_8_;
      local_58._0_8_ = (element_type *)0x0;
      std::__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
      reset((__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
             *)&utask.handler_,(pointer)__p);
      std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
      ~unique_ptr((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                   *)local_58);
      __buf_00 = extraout_RDX_00;
    }
    UdpSocket::send(this->socket_,(int)&utask,__buf_00,__n_00,__flags);
    udp_io_task::~udp_io_task(&utask);
    return extraout_RAX;
  }
  __assert_fail("socket_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.cpp"
                ,8,"void Liby::UdpConnection::send(const char *, off_t, const BasicHandler &)");
}

Assistant:

void UdpConnection::send(const char *base, off_t len,
                         const BasicHandler &handler) {
    assert(socket_);
    udp_io_task utask;
    utask.buffer_ = std::make_shared<Buffer>(base, len);
    utask.dest_ = &peer_;
    if (handler) {
        utask.handler_ = std::make_unique<BasicHandler>(handler);
    }
    socket_->send(std::move(utask));
}